

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O3

void __thiscall cppcms::http::content_type::content_type(content_type *this,string *ct)

{
  _Rb_tree_header *p_Var1;
  char *begin;
  data *__p;
  
  __p = (data *)operator_new(0x90);
  (__p->subtype)._M_dataplus._M_p = (pointer)0x0;
  (__p->subtype)._M_string_length = 0;
  (__p->subtype).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__p->subtype).field_2 + 8) = 0;
  (__p->media_type)._M_dataplus._M_p = (pointer)0x0;
  (__p->media_type)._M_string_length = 0;
  (__p->media_type).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__p->media_type).field_2 + 8) = 0;
  (__p->type).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__p->type).field_2 + 8) = 0;
  *(undefined8 *)&(__p->parameters)._M_t._M_impl = 0;
  *(undefined8 *)&(__p->parameters)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__p->type)._M_dataplus._M_p = (pointer)&(__p->type).field_2;
  (__p->type)._M_string_length = 0;
  (__p->subtype)._M_dataplus._M_p = (pointer)&(__p->subtype).field_2;
  (__p->subtype).field_2._M_local_buf[0] = '\0';
  (__p->media_type)._M_dataplus._M_p = (pointer)&(__p->media_type).field_2;
  (__p->media_type).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__p->parameters)._M_t._M_impl.super__Rb_tree_header;
  (__p->parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p->parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p->parameters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->d).super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cppcms::http::content_type::data*>
            (&(this->d).
              super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  begin = (ct->_M_dataplus)._M_p;
  parse(this,begin,begin + ct->_M_string_length);
  return;
}

Assistant:

content_type::content_type(std::string const &ct) :
		d(new content_type::data())
	{
		char const *begin = ct.c_str();
		char const *end = begin + ct.size();
		parse(begin,end);
	}